

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

int __thiscall
cmCTest::GenerateNotesFile
          (cmCTest *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files)

{
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var1;
  bool bVar2;
  ostream *poVar3;
  char *local_420 [4];
  cmXMLWriter xml;
  cmGeneratedFileStream ofs;
  
  cmGeneratedFileStream::cmGeneratedFileStream(&ofs,None);
  _Var1._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&xml,"Notes.xml",(allocator<char> *)local_420);
  bVar2 = OpenOutputFile(this,&(_Var1._M_head_impl)->CurrentTag,(string *)&xml,&ofs,false);
  std::__cxx11::string::~string((string *)&xml);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&xml);
    poVar3 = std::operator<<((ostream *)&xml,"Cannot open notes file");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::stringbuf::str();
    Log(this,7,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0x625,local_420[0],false);
    std::__cxx11::string::~string((string *)local_420);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&xml);
  }
  else {
    cmXMLWriter::cmXMLWriter(&xml,(ostream *)&ofs,0);
    GenerateCTestNotesOutput(this,&xml,files);
    cmXMLWriter::~cmXMLWriter(&xml);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&ofs);
  return (uint)!bVar2;
}

Assistant:

int cmCTest::GenerateNotesFile(std::vector<std::string> const& files)
{
  cmGeneratedFileStream ofs;
  if (!this->OpenOutputFile(this->Impl->CurrentTag, "Notes.xml", ofs)) {
    cmCTestLog(this, ERROR_MESSAGE, "Cannot open notes file" << std::endl);
    return 1;
  }
  cmXMLWriter xml(ofs);
  this->GenerateCTestNotesOutput(xml, files);
  return 0;
}